

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accelerometer-gyrometer.cpp
# Opt level: O0

void __thiscall
stateObservation::AccelerometerGyrometer::AccelerometerGyrometer(AccelerometerGyrometer *this)

{
  ConstantReturnType local_68;
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_50;
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_40 [2];
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
  local_20;
  AccelerometerGyrometer *local_10;
  AccelerometerGyrometer *this_local;
  
  local_10 = this;
  AlgebraicSensor::AlgebraicSensor(&this->super_AlgebraicSensor);
  algorithm::LinearAcceleration::LinearAcceleration(&this->super_LinearAcceleration);
  algorithm::RotationVelocity::RotationVelocity(&this->super_RotationVelocity);
  (this->super_AlgebraicSensor).super_SensorBase._vptr_SensorBase =
       (_func_int **)&PTR__AccelerometerGyrometer_006b2ba0;
  (this->super_LinearAcceleration)._vptr_LinearAcceleration =
       (_func_int **)&PTR__AccelerometerGyrometer_006b2c38;
  (this->super_RotationVelocity)._vptr_RotationVelocity =
       (_func_int **)&PTR__AccelerometerGyrometer_006b2c58;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Zero();
  Eigen::Matrix<double,3,3,0,3,3>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
            ((Matrix<double,3,3,0,3,3> *)&this->r_,&local_20);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Zero();
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            ((Matrix<double,3,1,0,3,1> *)&this->acc_,local_40);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Zero();
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            ((Matrix<double,3,1,0,3,1> *)&this->omega_,&local_50);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero(&local_68,6,1);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((Matrix<double,_1,1,0,_1,1> *)&this->output_,&local_68);
  this->currentStateSize_ = 10;
  this->matrixMode_ = false;
  return;
}

Assistant:

AccelerometerGyrometer::AccelerometerGyrometer():
    r_(Matrix3::Zero()),
    acc_(Vector3::Zero()),
    omega_(Vector3::Zero()),
    output_(Vector::Zero(measurementSize_,1)),
    currentStateSize_(stateSize_)
    {
#ifdef STATEOBSERVATION_VERBOUS_CONSTRUCTORS
      std::cout<<std::endl<<"AccelerometerGyrometer Constructor"<<std::endl;
#endif //STATEOBSERVATION_VERBOUS_CONSTRUCTOR

      matrixMode_=false;
    }